

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportBuildFileGenerator.cxx
# Opt level: O3

bool __thiscall
cmExportBuildFileGenerator::GenerateMainFile(cmExportBuildFileGenerator *this,ostream *os)

{
  _Base_ptr *pp_Var1;
  pointer *pppcVar2;
  ulong uVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  iterator __position;
  cmGlobalGenerator *pcVar5;
  cmGeneratorTarget *this_00;
  cmake *pcVar6;
  string *psVar7;
  byte bVar8;
  pointer pbVar9;
  byte bVar10;
  bool bVar11;
  TargetType TVar12;
  int iVar13;
  PolicyStatus PVar14;
  undefined8 *puVar15;
  string *psVar16;
  ostream *poVar17;
  string *c;
  pointer ppcVar18;
  undefined8 uVar19;
  pointer name;
  pair<std::_Rb_tree_iterator<cmGeneratorTarget_*>,_bool> pVar20;
  string expectedTargets;
  cmGeneratorTarget *te;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  missingTargets;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  targets;
  ostringstream e;
  string local_268;
  ostream *local_248;
  cmGeneratorTarget *local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1f8;
  string local_1f0;
  vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *local_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  undefined1 local_1a8 [16];
  _Base_ptr local_198;
  _Base_ptr p_Stack_190;
  _Base_ptr local_188;
  size_t local_180;
  ios_base local_138 [264];
  
  local_268._M_dataplus._M_p = (pointer)&local_268.field_2;
  local_268._M_string_length = 0;
  local_268.field_2._M_local_buf[0] = '\0';
  local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  local_238._M_string_length = 0;
  local_238.field_2._M_allocated_capacity =
       local_238.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (string *)0x0;
  local_1c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (string *)0x0;
  local_248 = os;
  GetTargets(this,&local_1c8);
  pbVar9 = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_1c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_1f8 = &(this->super_cmExportFileGenerator).Namespace;
    local_1d0 = (vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&this->Exports;
    name = local_1c8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
    bVar10 = 0;
    do {
      bVar8 = bVar10;
      local_240 = cmLocalGenerator::FindGeneratorTargetToUse(this->LG,name);
      std::operator+(&local_218,&local_238,local_1f8);
      cmGeneratorTarget::GetExportName_abi_cxx11_(&local_1f0,local_240);
      uVar19 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        uVar19 = local_218.field_2._M_allocated_capacity;
      }
      uVar3 = (long)(_func_int ***)local_1f0._M_string_length + local_218._M_string_length;
      if ((ulong)uVar19 < uVar3) {
        uVar19 = 0xf;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
          uVar19 = local_1f0.field_2._M_allocated_capacity;
        }
        if ((ulong)uVar19 < uVar3) goto LAB_0035c899;
        puVar15 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_1f0,0,(char *)0x0,(ulong)local_218._M_dataplus._M_p);
      }
      else {
LAB_0035c899:
        puVar15 = (undefined8 *)
                  std::__cxx11::string::_M_append
                            ((char *)&local_218,(ulong)local_1f0._M_dataplus._M_p);
      }
      pp_Var1 = (_Base_ptr *)(puVar15 + 2);
      if ((_Base_ptr *)*puVar15 == pp_Var1) {
        local_198 = *pp_Var1;
        p_Stack_190 = (_Base_ptr)puVar15[3];
        local_1a8._0_8_ = &local_198;
      }
      else {
        local_198 = *pp_Var1;
        local_1a8._0_8_ = (_Base_ptr *)*puVar15;
      }
      local_1a8._8_8_ = puVar15[1];
      *puVar15 = pp_Var1;
      puVar15[1] = 0;
      *(undefined1 *)pp_Var1 = 0;
      std::__cxx11::string::_M_append((char *)&local_268,local_1a8._0_8_);
      if ((_Base_ptr *)local_1a8._0_8_ != &local_198) {
        operator_delete((void *)local_1a8._0_8_,(ulong)((long)&local_198->_M_color + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f0._M_dataplus._M_p != &local_1f0.field_2) {
        operator_delete(local_1f0._M_dataplus._M_p,local_1f0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::string::_M_replace
                ((ulong)&local_238,0,(char *)local_238._M_string_length,0x5ba5d9);
      pVar20 = std::
               _Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
               ::_M_insert_unique<cmGeneratorTarget*const&>
                         ((_Rb_tree<cmGeneratorTarget*,cmGeneratorTarget*,std::_Identity<cmGeneratorTarget*>,std::less<cmGeneratorTarget*>,std::allocator<cmGeneratorTarget*>>
                           *)&(this->super_cmExportFileGenerator).ExportedTargets,&local_240);
      if (((undefined1  [16])pVar20 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,"given target \"",0xe);
        psVar16 = cmGeneratorTarget::GetName_abi_cxx11_(local_240);
        poVar17 = std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_1a8,(psVar16->_M_dataplus)._M_p,
                             psVar16->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar17,"\" more than once.",0x11);
        pcVar6 = this->LG->GlobalGenerator->CMakeInstance;
        std::__cxx11::stringbuf::str();
        cmMakefile::GetBacktrace(this->LG->Makefile);
        cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_218,(cmListFileBacktrace *)&local_1f0);
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f0._M_string_length);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218._M_dataplus._M_p != &local_218.field_2) {
          operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar11 = false;
        goto LAB_0035cb59;
      }
      __position._M_current =
           (this->Exports).
           super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->Exports).
          super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        _M_realloc_insert<cmGeneratorTarget*const&>(local_1d0,__position,&local_240);
      }
      else {
        *__position._M_current = local_240;
        pppcVar2 = &(this->Exports).
                    super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppcVar2 = *pppcVar2 + 1;
      }
      TVar12 = cmGeneratorTarget::GetType(local_240);
      if (TVar12 == OBJECT_LIBRARY) {
        pcVar5 = this->LG->GlobalGenerator;
        iVar13 = (*pcVar5->_vptr_cmGlobalGenerator[0x25])(pcVar5,0);
        bVar10 = (byte)iVar13 ^ 1;
        TVar12 = (uint)bVar10 + (uint)bVar10 * 2 + OBJECT_LIBRARY;
      }
      name = name + 1;
      bVar10 = bVar8 | TVar12 == INTERFACE_LIBRARY;
    } while (name != pbVar9);
    if ((bool)(bVar8 | TVar12 == INTERFACE_LIBRARY)) {
      (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0x10])
                (this,local_248,"3.0.0");
    }
  }
  bVar11 = true;
  (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xb])(this,local_248,&local_268)
  ;
LAB_0035cb59:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_1c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_268._M_dataplus._M_p != &local_268.field_2) {
    operator_delete(local_268._M_dataplus._M_p,
                    CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                             local_268.field_2._M_local_buf[0]) + 1);
  }
  if (bVar11) {
    local_238._M_dataplus._M_p = (pointer)0x0;
    local_238._M_string_length = 0;
    local_238.field_2._M_allocated_capacity = 0;
    ppcVar18 = (this->Exports).
               super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    local_1f8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (this->Exports).
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppcVar18 != local_1f8)
    {
      do {
        this_00 = *ppcVar18;
        TVar12 = cmGeneratorTarget::GetType(this_00);
        paVar4 = &local_268.field_2;
        if (TVar12 == OBJECT_LIBRARY) {
          pcVar5 = this->LG->GlobalGenerator;
          (*pcVar5->_vptr_cmGlobalGenerator[0x25])(pcVar5,0);
        }
        (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[6])
                  (this,local_248,this_00);
        cmTarget::AppendBuildInterfaceIncludes(this_00->Target);
        local_1a8._8_8_ = local_1a8._8_8_ & 0xffffffff00000000;
        local_198 = (_Base_ptr)0x0;
        p_Stack_190 = (_Base_ptr)(local_1a8 + 8);
        local_180 = 0;
        local_268._M_dataplus._M_p = (pointer)paVar4;
        local_188 = p_Stack_190;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_INCLUDE_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_268,"INTERFACE_SOURCES","")
        ;
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_COMPILE_DEFINITIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_COMPILE_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_AUTOUIC_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_COMPILE_FEATURES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_LINK_OPTIONS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_LINK_DIRECTORIES","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_LINK_DEPENDS","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,BuildInterface,
                   (ImportPropertyMap *)local_1a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_dataplus._M_p = (pointer)paVar4;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_268,"INTERFACE_POSITION_INDEPENDENT_CODE","");
        cmExportFileGenerator::PopulateInterfaceProperty
                  (&this->super_cmExportFileGenerator,&local_268,this_00,
                   (ImportPropertyMap *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != paVar4) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        local_268._M_string_length = 0;
        local_268.field_2._M_local_buf[0] = '\0';
        local_268._M_dataplus._M_p = (pointer)paVar4;
        bVar11 = cmExportFileGenerator::PopulateExportProperties
                           (&this->super_cmExportFileGenerator,this_00,
                            (ImportPropertyMap *)local_1a8,&local_268);
        if (bVar11) {
          PVar14 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022);
          if ((PVar14 != WARN) &&
             (PVar14 = cmPolicies::PolicyMap::Get(&this_00->PolicyMap,CMP0022), PVar14 != OLD)) {
            cmExportFileGenerator::PopulateInterfaceLinkLibrariesProperty
                      (&this->super_cmExportFileGenerator,this_00,BuildInterface,
                       (ImportPropertyMap *)local_1a8,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_238);
          }
          cmExportFileGenerator::PopulateCompatibleInterfaceProperties
                    (&this->super_cmExportFileGenerator,this_00,(ImportPropertyMap *)local_1a8);
          (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[0xf])
                    (this,this_00,local_248,local_1a8);
        }
        else {
          pcVar6 = this->LG->GlobalGenerator->CMakeInstance;
          cmMakefile::GetBacktrace(this->LG->Makefile);
          cmake::IssueMessage(pcVar6,FATAL_ERROR,&local_268,(cmListFileBacktrace *)&local_218);
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_218._M_string_length);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_268._M_dataplus._M_p != &local_268.field_2) {
          operator_delete(local_268._M_dataplus._M_p,
                          CONCAT71(local_268.field_2._M_allocated_capacity._1_7_,
                                   local_268.field_2._M_local_buf[0]) + 1);
        }
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_1a8);
        if (!bVar11) {
          bVar11 = false;
          goto LAB_0035d0db;
        }
        ppcVar18 = ppcVar18 + 1;
      } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)ppcVar18 !=
               local_1f8);
    }
    psVar16 = (this->super_cmExportFileGenerator).Configurations.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    psVar7 = (this->super_cmExportFileGenerator).Configurations.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar16 != psVar7) {
      do {
        cmExportFileGenerator::GenerateImportConfig
                  (&this->super_cmExportFileGenerator,local_248,psVar16,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_238);
        psVar16 = psVar16 + 1;
      } while (psVar16 != psVar7);
    }
    bVar11 = true;
    (*(this->super_cmExportFileGenerator)._vptr_cmExportFileGenerator[10])
              (this,local_248,&local_238);
LAB_0035d0db:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_238);
  }
  else {
    bVar11 = false;
  }
  return bVar11;
}

Assistant:

bool cmExportBuildFileGenerator::GenerateMainFile(std::ostream& os)
{
  {
    std::string expectedTargets;
    std::string sep;
    std::vector<std::string> targets;
    bool generatedInterfaceRequired = false;
    this->GetTargets(targets);
    for (std::string const& tei : targets) {
      cmGeneratorTarget* te = this->LG->FindGeneratorTargetToUse(tei);
      expectedTargets += sep + this->Namespace + te->GetExportName();
      sep = " ";
      if (this->ExportedTargets.insert(te).second) {
        this->Exports.push_back(te);
      } else {
        std::ostringstream e;
        e << "given target \"" << te->GetName() << "\" more than once.";
        this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR, e.str(),
          this->LG->GetMakefile()->GetBacktrace());
        return false;
      }
      generatedInterfaceRequired |=
        this->GetExportTargetType(te) == cmStateEnums::INTERFACE_LIBRARY;
    }

    if (generatedInterfaceRequired) {
      this->GenerateRequiredCMakeVersion(os, "3.0.0");
    }
    this->GenerateExpectedTargetsCode(os, expectedTargets);
  }

  std::vector<std::string> missingTargets;

  // Create all the imported targets.
  for (cmGeneratorTarget* gte : this->Exports) {
    this->GenerateImportTargetCode(os, gte, this->GetExportTargetType(gte));

    gte->Target->AppendBuildInterfaceIncludes();

    ImportPropertyMap properties;

    this->PopulateInterfaceProperty("INTERFACE_INCLUDE_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_SOURCES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_DEFINITIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_AUTOUIC_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_COMPILE_FEATURES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_OPTIONS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DIRECTORIES", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_LINK_DEPENDS", gte,
                                    cmGeneratorExpression::BuildInterface,
                                    properties, missingTargets);
    this->PopulateInterfaceProperty("INTERFACE_POSITION_INDEPENDENT_CODE", gte,
                                    properties);

    std::string errorMessage;
    if (!this->PopulateExportProperties(gte, properties, errorMessage)) {
      this->LG->GetGlobalGenerator()->GetCMakeInstance()->IssueMessage(
        MessageType::FATAL_ERROR, errorMessage,
        this->LG->GetMakefile()->GetBacktrace());
      return false;
    }

    const bool newCMP0022Behavior =
      gte->GetPolicyStatusCMP0022() != cmPolicies::WARN &&
      gte->GetPolicyStatusCMP0022() != cmPolicies::OLD;
    if (newCMP0022Behavior) {
      this->PopulateInterfaceLinkLibrariesProperty(
        gte, cmGeneratorExpression::BuildInterface, properties,
        missingTargets);
    }
    this->PopulateCompatibleInterfaceProperties(gte, properties);

    this->GenerateInterfaceProperties(gte, os, properties);
  }

  // Generate import file content for each configuration.
  for (std::string const& c : this->Configurations) {
    this->GenerateImportConfig(os, c, missingTargets);
  }

  this->GenerateMissingTargetsCheckCode(os, missingTargets);

  return true;
}